

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* nlohmann::
  json_pointer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::split(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *__return_storage_ptr__,string *reference_string)

{
  long lVar1;
  ulong uVar2;
  char *pcVar3;
  long lVar4;
  parse_error *ppVar5;
  bool bVar6;
  long local_130;
  allocator local_c9;
  string local_c8;
  long local_a8;
  size_t pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> reference_token;
  size_t start;
  size_t slash;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_19;
  string *local_18;
  string *reference_string_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *result;
  
  local_19 = 0;
  local_18 = reference_string;
  reference_string_local = (string *)__return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
    if (*pcVar3 != '/') {
      ppVar5 = (parse_error *)__cxa_allocate_exception(0x28);
      std::operator+(&local_60,"JSON pointer must be empty or begin with \'/\' - was: \'",local_18);
      std::operator+(&local_40,&local_60,"\'");
      detail::parse_error::create(ppVar5,0x6b,1,&local_40);
      __cxa_throw(ppVar5,&detail::parse_error::typeinfo,detail::parse_error::~parse_error);
    }
    start = std::__cxx11::string::find_first_of((char)local_18,0x2f);
    reference_token.field_2._8_8_ = 1;
    while (reference_token.field_2._8_8_ != 0) {
      std::__cxx11::string::substr((ulong)&pos,(ulong)local_18);
      local_a8 = std::__cxx11::string::find_first_of((char)&pos,0x7e);
      while (local_a8 != -1) {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&pos);
        lVar1 = local_a8;
        if (*pcVar3 != '~') {
          __assert_fail("reference_token[pos] == \'~\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                        ,0x28ee,
                        "static std::vector<std::string> nlohmann::json_pointer<nlohmann::basic_json<>>::split(const std::string &) [BasicJsonType = nlohmann::basic_json<>]"
                       );
        }
        lVar4 = std::__cxx11::string::size();
        bVar6 = true;
        if (lVar1 != lVar4 + -1) {
          pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&pos);
          bVar6 = false;
          if (*pcVar3 != '0') {
            pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&pos);
            bVar6 = *pcVar3 != '1';
          }
        }
        if (bVar6) {
          ppVar5 = (parse_error *)__cxa_allocate_exception(0x28);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_c8,
                     "escape character \'~\' must be followed with \'0\' or \'1\'",&local_c9);
          detail::parse_error::create(ppVar5,0x6c,0,&local_c8);
          __cxa_throw(ppVar5,&detail::parse_error::typeinfo,detail::parse_error::~parse_error);
        }
        local_a8 = std::__cxx11::string::find_first_of((char)&pos,0x7e);
      }
      unescape((string *)&pos);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)&pos);
      std::__cxx11::string::~string((string *)&pos);
      if (start == 0xffffffffffffffff) {
        local_130 = 0;
      }
      else {
        local_130 = start + 1;
      }
      reference_token.field_2._8_8_ = local_130;
      start = std::__cxx11::string::find_first_of((char)local_18,0x2f);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<std::string> split(const std::string& reference_string) {
		std::vector<std::string> result;

		// special case: empty reference string -> no reference tokens
		if (reference_string.empty()) {
			return result;
		}

		// check if nonempty reference string begins with slash
		if (JSON_UNLIKELY(reference_string[0] != '/')) {
			JSON_THROW(detail::parse_error::create(
				107, 1, "JSON pointer must be empty or begin with '/' - was: '" + reference_string + "'"));
		}

		// extract the reference tokens:
		// - slash: position of the last read slash (or end of string)
		// - start: position after the previous slash
		for (
			// search for the first slash after the first character
			std::size_t slash = reference_string.find_first_of('/', 1),
						// set the beginning of the first reference token
			start = 1;
			// we can stop if start == 0 (if slash == std::string::npos)
			start != 0;
			// set the beginning of the next reference token
			// (will eventually be 0 if slash == std::string::npos)
			start = (slash == std::string::npos) ? 0 : slash + 1,
						// find next slash
			slash = reference_string.find_first_of('/', start)) {
			// use the text between the beginning of the reference token
			// (start) and the last slash (slash).
			auto reference_token = reference_string.substr(start, slash - start);

			// check reference tokens are properly escaped
			for (std::size_t pos = reference_token.find_first_of('~'); pos != std::string::npos;
				 pos = reference_token.find_first_of('~', pos + 1)) {
				assert(reference_token[pos] == '~');

				// ~ must be followed by 0 or 1
				if (JSON_UNLIKELY(pos == reference_token.size() - 1 or
								  (reference_token[pos + 1] != '0' and reference_token[pos + 1] != '1'))) {
					JSON_THROW(
						detail::parse_error::create(108, 0, "escape character '~' must be followed with '0' or '1'"));
				}
			}

			// finally, store the reference token
			unescape(reference_token);
			result.push_back(reference_token);
		}

		return result;
	}